

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

Integer pnga_inquire_memory(void)

{
  ulong uVar1;
  Integer IVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)_max_global_array;
  if (_max_global_array < 1) {
    uVar1 = uVar3;
  }
  IVar2 = 0;
  for (; uVar1 * 0x368 - uVar3 != 0; uVar3 = uVar3 + 0x368) {
    if (*(int *)((long)GA->dims + (uVar3 - 0x28)) != 0) {
      IVar2 = IVar2 + *(long *)((long)GA->dims + (uVar3 - 0x20));
    }
  }
  return IVar2;
}

Assistant:

Integer pnga_inquire_memory()
{
Integer i, sum=0;
    for(i=0; i<_max_global_array; i++) 
        if(GA[i].actv) sum += (Integer)GA[i].size; 
    return(sum);
}